

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getinfo.c
# Opt level: O1

CURLcode Curl_getinfo(SessionHandle *data,CURLINFO info,...)

{
  double dVar1;
  curl_socket_t cVar2;
  curl_slist *pcVar3;
  char *pcVar4;
  char *pcVar5;
  CURLcode CVar6;
  curl_tlssessioninfo **tsip;
  va_list arg;
  double *local_b8;
  
  if (data == (SessionHandle *)0x0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  CVar6 = CURLE_BAD_FUNCTION_ARGUMENT;
  switch((info & 0xf00000) - 0x100000 >> 0x14) {
  case CURLINFO_NONE:
    if (local_b8 == (double *)0x0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if ((int)info < 0x10001e) {
      if (info == CURLINFO_EFFECTIVE_URL) {
        pcVar4 = (data->change).url;
        pcVar5 = "";
        if (pcVar4 != (char *)0x0) {
          pcVar5 = pcVar4;
        }
        *local_b8 = (double)pcVar5;
        break;
      }
      if (info == CURLINFO_CONTENT_TYPE) {
        pcVar4 = (data->info).contenttype;
      }
      else {
        if (info != CURLINFO_PRIVATE) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        pcVar4 = (char *)(data->set).private_data;
      }
      goto LAB_0011ff3a;
    }
    switch(info) {
    case CURLINFO_FTP_ENTRY_PATH:
      pcVar4 = (data->state).most_recent_ftp_entrypath;
      break;
    case CURLINFO_REDIRECT_URL:
      pcVar4 = (data->info).wouldredirect;
      break;
    case CURLINFO_PRIMARY_IP:
      pcVar4 = (data->info).conn_primary_ip;
      goto LAB_0011ff0e;
    default:
      goto switchD_0011fcd2_default;
    case CURLINFO_RTSP_SESSION_ID:
      pcVar4 = (data->set).str[0x22];
      break;
    case CURLINFO_LOCAL_IP:
      pcVar4 = (data->info).conn_local_ip;
LAB_0011ff0e:
      *local_b8 = (double)pcVar4;
      goto LAB_001200d0;
    }
LAB_0011ff3a:
    *local_b8 = (double)pcVar4;
    break;
  case 1:
    if (local_b8 == (double *)0x0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    switch(info) {
    case CURLINFO_RESPONSE_CODE:
      pcVar3 = (curl_slist *)(long)(data->info).httpcode;
      break;
    default:
      goto switchD_0011fcd2_default;
    case CURLINFO_HEADER_SIZE:
      pcVar3 = (curl_slist *)(data->info).header_size;
      break;
    case CURLINFO_REQUEST_SIZE:
      pcVar3 = (curl_slist *)(data->info).request_size;
      break;
    case CURLINFO_SSL_VERIFYRESULT:
      pcVar3 = (curl_slist *)(data->set).ssl.certverifyresult;
      break;
    case CURLINFO_FILETIME:
      pcVar3 = (curl_slist *)(data->info).filetime;
      break;
    case CURLINFO_REDIRECT_COUNT:
      pcVar3 = (curl_slist *)(data->set).followlocation;
      break;
    case CURLINFO_HTTP_CONNECTCODE:
      pcVar3 = (curl_slist *)(long)(data->info).httpproxycode;
      break;
    case CURLINFO_HTTPAUTH_AVAIL:
      pcVar3 = (curl_slist *)(data->info).httpauthavail;
      break;
    case CURLINFO_PROXYAUTH_AVAIL:
      pcVar3 = (curl_slist *)(data->info).proxyauthavail;
      break;
    case CURLINFO_OS_ERRNO:
      pcVar3 = (curl_slist *)(long)(data->state).os_errno;
      break;
    case CURLINFO_NUM_CONNECTS:
      pcVar3 = (curl_slist *)(data->info).numconnects;
      break;
    case CURLINFO_LASTSOCKET:
      cVar2 = Curl_getconnectinfo(data,(connectdata **)0x0);
      if (cVar2 != -1) {
        *local_b8 = (double)(long)cVar2;
        return CURLE_OK;
      }
      *local_b8 = -NAN;
      return CURLE_OK;
    case CURLINFO_CONDITION_UNMET:
      pcVar3 = (curl_slist *)(ulong)(data->info).timecond;
      break;
    case CURLINFO_RTSP_CLIENT_CSEQ:
      pcVar3 = (curl_slist *)(data->state).rtsp_next_client_CSeq;
      break;
    case CURLINFO_RTSP_SERVER_CSEQ:
      pcVar3 = (curl_slist *)(data->state).rtsp_next_server_CSeq;
      break;
    case CURLINFO_RTSP_CSEQ_RECV:
      pcVar3 = (curl_slist *)(data->state).rtsp_CSeq_recv;
      break;
    case CURLINFO_PRIMARY_PORT:
      pcVar3 = (curl_slist *)(data->info).conn_primary_port;
      break;
    case CURLINFO_LOCAL_PORT:
      pcVar3 = (curl_slist *)(data->info).conn_local_port;
    }
LAB_001200bb:
    *local_b8 = (double)pcVar3;
    break;
  case 2:
    if (local_b8 == (double *)0x0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    switch(info) {
    case CURLINFO_TOTAL_TIME:
      dVar1 = (data->progress).timespent;
      break;
    case CURLINFO_NAMELOOKUP_TIME:
      dVar1 = (data->progress).t_nslookup;
      break;
    case CURLINFO_CONNECT_TIME:
      dVar1 = (data->progress).t_connect;
      break;
    case CURLINFO_PRETRANSFER_TIME:
      dVar1 = (data->progress).t_pretransfer;
      break;
    case CURLINFO_SIZE_UPLOAD:
      dVar1 = (double)(data->progress).uploaded;
      break;
    case CURLINFO_SIZE_DOWNLOAD:
      dVar1 = (double)(data->progress).downloaded;
      break;
    case CURLINFO_SPEED_DOWNLOAD:
      dVar1 = (double)(data->progress).dlspeed;
      break;
    case CURLINFO_SPEED_UPLOAD:
      dVar1 = (double)(data->progress).ulspeed;
      break;
    default:
      goto switchD_0011fcd2_default;
    case CURLINFO_CONTENT_LENGTH_DOWNLOAD:
      if (((data->progress).flags & 0x40) == 0) {
LAB_0011fffb:
        dVar1 = -1.0;
      }
      else {
        dVar1 = (double)(data->progress).size_dl;
      }
      break;
    case CURLINFO_CONTENT_LENGTH_UPLOAD:
      if (((data->progress).flags & 0x20) == 0) goto LAB_0011fffb;
      dVar1 = (double)(data->progress).size_ul;
      break;
    case CURLINFO_STARTTRANSFER_TIME:
      dVar1 = (data->progress).t_starttransfer;
      break;
    case CURLINFO_REDIRECT_TIME:
      dVar1 = (data->progress).t_redirect;
      break;
    case CURLINFO_APPCONNECT_TIME:
      dVar1 = (data->progress).t_appconnect;
    }
    *local_b8 = dVar1;
    break;
  case 3:
    if (local_b8 == (double *)0x0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if ((int)info < 0x400022) {
      if (info != CURLINFO_SSL_ENGINES) {
        if (info != CURLINFO_COOKIELIST) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        pcVar3 = Curl_cookie_list(data);
        goto LAB_001200bb;
      }
      *local_b8 = 0.0;
    }
    else if (info == CURLINFO_CERTINFO) {
      *local_b8 = (double)&(data->info).certs;
    }
    else {
      if (info != CURLINFO_TLS_SESSION) {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      *local_b8 = (double)&data->tsi;
      (data->tsi).backend = CURLSSLBACKEND_NONE;
      (data->tsi).internals = (void *)0x0;
    }
    break;
  default:
    goto switchD_0011fcd2_default;
  }
LAB_001200d0:
  CVar6 = CURLE_OK;
switchD_0011fcd2_default:
  return CVar6;
}

Assistant:

CURLcode Curl_getinfo(struct SessionHandle *data, CURLINFO info, ...)
{
  va_list arg;
  long *param_longp = NULL;
  double *param_doublep = NULL;
  char **param_charp = NULL;
  struct curl_slist **param_slistp = NULL;
  int type;
  /* default return code is to error out! */
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;

  if(!data)
    return result;

  va_start(arg, info);

  type = CURLINFO_TYPEMASK & (int)info;
  switch(type) {
  case CURLINFO_STRING:
    param_charp = va_arg(arg, char **);
    if(param_charp)
      result = getinfo_char(data, info, param_charp);
    break;
  case CURLINFO_LONG:
    param_longp = va_arg(arg, long *);
    if(param_longp)
      result = getinfo_long(data, info, param_longp);
    break;
  case CURLINFO_DOUBLE:
    param_doublep = va_arg(arg, double *);
    if(param_doublep)
      result = getinfo_double(data, info, param_doublep);
    break;
  case CURLINFO_SLIST:
    param_slistp = va_arg(arg, struct curl_slist **);
    if(param_slistp)
      result = getinfo_slist(data, info, param_slistp);
    break;
  default:
    break;
  }

  va_end(arg);

  return result;
}